

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mod.c
# Opt level: O2

void ppDivMod(word *b,word *divident,word *a,word *mod,size_t n,void *stack)

{
  word *b_00;
  word *a_00;
  word *b_01;
  bool_t bVar1;
  int iVar2;
  word *a_01;
  word *b_02;
  size_t local_50;
  size_t local_48;
  
  b_00 = (word *)((long)stack + n * 8);
  b_01 = b_00 + n;
  a_00 = b_01 + n;
  wwCopy(b_01,divident,n);
  wwSetZero(a_00,n);
  wwCopy((word *)stack,a,n);
  local_50 = wwWordSize((word *)stack,n);
  wwCopy(b_00,mod,n);
  local_48 = n;
  while (bVar1 = wwIsZero((word *)stack,local_50), bVar1 == 0) {
    while (bVar1 = wwTestBit((word *)stack,0), bVar1 == 0) {
      bVar1 = wwTestBit(b_01,0);
      if (bVar1 != 0) {
        wwXor2(b_01,mod,n);
      }
      wwShLo(b_01,n,1);
      wwShLo((word *)stack,local_50,1);
    }
    while (bVar1 = wwTestBit(b_00,0), bVar1 == 0) {
      bVar1 = wwTestBit(a_00,0);
      if (bVar1 != 0) {
        wwXor2(a_00,mod,n);
      }
      wwShLo(a_00,n,1);
      wwShLo(b_00,local_48,1);
    }
    local_50 = wwWordSize((word *)stack,local_50);
    local_48 = wwWordSize(b_00,local_48);
    iVar2 = wwCmp2((word *)stack,local_50,b_00,local_48);
    if (iVar2 < 0) {
      wwXor2(b_00,(word *)stack,local_50);
      a_01 = b_01;
      b_02 = a_00;
    }
    else {
      wwXor2((word *)stack,b_00,local_48);
      a_01 = a_00;
      b_02 = b_01;
    }
    wwXor2(b_02,a_01,n);
  }
  bVar1 = wwIsW(b_00,local_48,1);
  if (bVar1 == 0) {
    wwSetZero(b,n);
    return;
  }
  wwCopy(b,a_00,n);
  return;
}

Assistant:

void ppDivMod(word b[], const word divident[], const word a[],
	const word mod[], size_t n, void* stack)
{
	size_t nu, nv;
	// переменные в stack
	word* u = (word*)stack;
	word* v = u + n;
	word* da0 = v + n;
	word* da = da0 + n;
	stack = da + n;
	// pre
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwCmp(divident, mod, n) < 0);
	ASSERT(n > 0 && mod[n - 1] != 0 && wwTestBit(mod, 0));
	ASSERT(wwIsValid(b, n));
	// da0 <- divident, da <- 0
	wwCopy(da0, divident, n);
	wwSetZero(da, n);
	// u <- a, v <- mod
	wwCopy(u, a, n);
	nu = wwWordSize(u, n);
	wwCopy(v, mod, n);
	nv = n;
	// итерации со следующими инвариантами:
	//	da0 * a \equiv divident * u \mod mod
	//	da * a \equiv divident * v \mod mod
	while (!wwIsZero(u, nu))
	{
		// пока u делится на x
		for (; wwTestBit(u, 0) == 0; wwShLo(u, nu, 1))
			if (wwTestBit(da0, 0) == 0)
				// da0 <- da0 / x
				wwShLo(da0, n, 1);
			else
				// da0 <- (da0 + mod) / 2
				wwXor2(da0, mod, n), wwShLo(da0, n, 1);
		// пока v делится на x
		for (; wwTestBit(v, 0) == 0; wwShLo(v, nv, 1))
			if (wwTestBit(da, 0) == 0)
				// da <- da / x
				wwShLo(da, n, 1);
			else
				// da <- (da + mod) / 2
				wwXor2(da, mod, n), wwShLo(da, n, 1);
		// нормализация
		nu = wwWordSize(u, nu);
		nv = wwWordSize(v, nv);
		// u >= v?
		if (wwCmp2(u, nu, v, nv) >= 0)
		{
			// u <- u + v, da0 <- da0 + da
			wwXor2(u, v, nv);
			wwXor2(da0, da, n);
		}
		else
		{
			// v <- v + u, da <- da + da0
			wwXor2(v, u, nu);
			wwXor2(da, da0, n);
		}
	}
	// здесь v == \gcd(a, mod)
	EXPECT(wwIsW(v, nv, 1));
	// \gcd(a, mod) == 1 ? b <- da : b <- 0
	if (wwIsW(v, nv, 1))
		wwCopy(b, da, n);
	else
		wwSetZero(b, n);
}